

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# divider_tests.cpp
# Opt level: O2

void __thiscall
DividerTest_DivisionByZero_Test::DividerTest_DivisionByZero_Test
          (DividerTest_DivisionByZero_Test *this)

{
  DividerTest::DividerTest(&this->super_DividerTest);
  (this->super_DividerTest).super_Test._vptr_Test = (_func_int **)&PTR__DividerTest_00151140;
  return;
}

Assistant:

TEST_F(DividerTest, DivisionByZero) {
  Division d = Division(Fraction{1, 0});
  try {
    d.divide();
    FAIL() << "Expected divide() method to throw DivisionByZeroException";
  } catch (DivisionByZero const &err) {
    EXPECT_EQ(err.what(), DIVISION_BY_ZERO_MESSAGE);
  }
  catch (...) {
    FAIL() << "Expected DivisionByZeroException!";
  }
}